

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

Err * __thiscall
wasm::WATParser::Lexer::err(Err *__return_storage_ptr__,Lexer *this,size_t pos,string *reason)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  TextPos local_1d0 [2];
  stringstream local_1b0 [8];
  stringstream msg;
  ostream local_1a0 [376];
  string *local_28;
  string *reason_local;
  size_t pos_local;
  Lexer *this_local;
  
  local_28 = reason;
  reason_local = (string *)pos;
  pos_local = (size_t)this;
  this_local = (Lexer *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->file);
  if (bVar1) {
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->file);
    poVar3 = std::operator<<(local_1a0,(string *)pbVar2);
    std::operator<<(poVar3,":");
  }
  local_1d0[0] = position(this,(size_t)reason_local);
  poVar3 = WATParser::operator<<(local_1a0,local_1d0);
  poVar3 = std::operator<<(poVar3,": error: ");
  std::operator<<(poVar3,(string *)reason);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] Err err(size_t pos, std::string reason) {
    std::stringstream msg;
    if (file) {
      msg << *file << ":";
    }
    msg << position(pos) << ": error: " << reason;
    return Err{msg.str()};
  }